

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O2

shared_ptr<entityx::deps::Dependency<A,_B>_> __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B>>(SystemManager *this)

{
  Dependency<A,_B> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SystemManager *in_RSI;
  shared_ptr<entityx::deps::Dependency<A,_B>_> sVar1;
  __shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (Dependency<A,_B> *)operator_new(0x48);
  *(undefined8 *)
   &(__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
    _M_rehash_policy = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_buckets = &(__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.
                connections_._M_h._M_single_bucket;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_bucket_count = 1;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_element_count = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver.connections_._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  __p->super_System<entityx::deps::Dependency<A,_B>_> =
       (System<entityx::deps::Dependency<A,_B>_>)&PTR__Dependency_001eaa58;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B>_>).super_BaseReceiver._vptr_BaseReceiver =
       (_func_int **)&PTR__Dependency_001eaa90;
  std::__shared_ptr<entityx::deps::Dependency<A,B>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<entityx::deps::Dependency<A,B>,void>
            ((__shared_ptr<entityx::deps::Dependency<A,B>,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  Catch::clara::std::__shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_28,
               (__shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2> *)this);
  add<entityx::deps::Dependency<A,B>>
            (in_RSI,(shared_ptr<entityx::deps::Dependency<A,_B>_> *)&_Stack_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_28._M_refcount);
  sVar1.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<entityx::deps::Dependency<A,_B>_>)
         sVar1.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> add(Args && ... args) {
    std::shared_ptr<S> s(new S(std::forward<Args>(args) ...));
    add(s);
    return s;
  }